

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O1

void chapter1::demo3(void)

{
  long *plVar1;
  ostream *this;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int ival;
  vector<int,_std::allocator<int>_> ivec;
  int local_3c;
  int *local_38;
  iterator iStack_30;
  int *local_28;
  
  local_38 = (int *)0x0;
  iStack_30._M_current = (int *)0x0;
  local_28 = (int *)0x0;
  while (plVar1 = (long *)std::istream::operator>>((istream *)&std::cin,&local_3c),
        (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
    if (iStack_30._M_current == local_28) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_38,iStack_30,&local_3c);
    }
    else {
      *iStack_30._M_current = local_3c;
      iStack_30._M_current = iStack_30._M_current + 1;
    }
  }
  uVar2 = (long)iStack_30._M_current - (long)local_38 >> 2;
  if (iStack_30._M_current == local_38) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + local_38[lVar4];
      lVar4 = lVar4 + 1;
    } while (uVar2 + (uVar2 == 0) != lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sum is: ",8);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(this,", average is: ",0xe);
  plVar1 = (long *)std::ostream::operator<<((ostream *)this,(int)((ulong)(long)iVar3 / uVar2));
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  if (local_38 != (int *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void file_op() {
        ifstream ifile("/tmp/a.txt");
        if (!ifile) {
            cerr << "Oops! Cant't open the input file." << endl;
            exit(1);
        }

        ofstream ofile("/tmp/a.sort.txt");
        if (!ofile) {
            cerr << "Oops! Cant't open the output file." << endl;
            exit(1);
        }

        string word;
        vector<string> text;
        while (ifile >> word) {
            text.push_back(word);
        }

        cout << "Unsorted text: \n";

        int ix(0);
        for (; ix < text.size(); ++ix) {
            cout << text[ix] << " ";
        }
        cout << endl;

        // sort
        sort(text.begin(), text.end());

        ofile << "Sorted text: \n";
        for (ix = 0; ix < text.size(); ++ix) {
            ofile << text[ix] << " ";
        }
        ofile << endl;
    }